

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum_max.hpp
# Opt level: O2

pair<long_*,_long>
burst::partial_sum_max<long*,long*,std::plus<void>,std::less<void>>
          (long *first,long *last,long *result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  pair<long_*,_long> pVar4;
  
  if (first == last) {
    lVar3 = 0;
  }
  else {
    lVar2 = *first;
    *result = lVar2;
    result = result + 1;
    lVar3 = lVar2;
    for (first = first + 1; first != last; first = first + 1) {
      lVar1 = *first;
      if (lVar3 <= lVar1) {
        lVar3 = lVar1;
      }
      lVar2 = lVar2 + lVar1;
      *result = lVar2;
      result = result + 1;
    }
  }
  pVar4.second = lVar3;
  pVar4.first = result;
  return pVar4;
}

Assistant:

std::pair<OutputIterator, iterator_value_t<InputIterator>>
        partial_sum_max
        (
            InputIterator first,
            InputIterator last,
            OutputIterator result,
            BinaryFunction plus,
            BinaryPredicate less
        )
    {
        if (first != last)
        {
            auto sum = *first;
            auto max = sum;

            *result = sum;

            while (++first != last)
            {
                auto current = *first;
                if (less(max, current))
                {
                    max = current;
                }

                auto new_sum = plus(std::move(sum), std::move(current));
                sum = std::move(new_sum);

                ++result;
                *result = sum;
            }

            return {++result, max};
        }

        return {result, iterator_value_t<InputIterator>{}};
    }